

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O2

HRESULT __thiscall
Js::DebugDocument::SetBreakPoint(DebugDocument *this,int32 ibos,BREAKPOINT_STATE breakpointState)

{
  ScriptContext *pSVar1;
  StatementLocation statement_00;
  int iVar2;
  BOOL BVar3;
  HRESULT HVar4;
  undefined1 auStack_40 [8];
  StatementLocation statement;
  
  pSVar1 = (this->utf8SourceInfo->m_scriptContext).ptr;
  HVar4 = -0x7fff0001;
  if (pSVar1 != (ScriptContext *)0x0) {
    iVar2 = (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
    if ((char)iVar2 == '\0') {
      statement.function = (FunctionBody *)0x0;
      statement.statement.begin = 0;
      statement.statement.end = 0;
      BVar3 = GetStatementLocation(this,ibos,(StatementLocation *)auStack_40);
      if (BVar3 == 0) {
        HVar4 = -0x7fffbffb;
      }
      else {
        statement_00.statement = (Interval)statement.function;
        statement_00.function = (FunctionBody *)auStack_40;
        statement_00.bytecodeSpan = statement.statement;
        SetBreakPoint(this,statement_00,breakpointState);
        HVar4 = 0;
      }
    }
  }
  return HVar4;
}

Assistant:

HRESULT DebugDocument::SetBreakPoint(int32 ibos, BREAKPOINT_STATE breakpointState)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();

        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return E_UNEXPECTED;
        }

        StatementLocation statement;
        if (!this->GetStatementLocation(ibos, &statement))
        {
            return E_FAIL;
        }

        this->SetBreakPoint(statement, breakpointState);

        return S_OK;
    }